

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree_impl.hpp
# Opt level: O1

int __thiscall
Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::remove
          (SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs> *this,char *__filename)

{
  Node ****ppppNVar1;
  TermList **ppTVar2;
  uint uVar3;
  IntermediateNode *pIVar4;
  uint64_t uVar5;
  TermList *pTVar6;
  TermList *pTVar7;
  Node ***pppNVar8;
  Node ***pppNVar9;
  Node *pNVar10;
  Node ***pppNVar11;
  TermList TVar12;
  Self SVar13;
  int iVar14;
  int extraout_EAX;
  Entry *pEVar15;
  Node **inode;
  ulong uVar16;
  DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>_>_>_>
  *in_RDX;
  ulong uVar17;
  Node *node;
  anon_class_16_2_f84bbffd f;
  Top TVar18;
  Stack<Kernel::TermList_*> subterms;
  TermList t;
  Recycled<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::Node_**>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  history;
  Stack<Kernel::TermList_*> local_a8;
  TermList local_88;
  Recycled<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::Node_**>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  local_80;
  DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>_>_>_>
  *local_70;
  ulong local_68 [6];
  undefined4 local_38;
  undefined4 extraout_var;
  
  inode = &this->_root;
  local_70 = in_RDX;
  ::Lib::
  Recycled<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::Node_**>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  ::Recycled(&local_80);
  while (iVar14 = (*(((IntermediateNode *)*inode)->super_Node)._vptr_Node[2])(),
        SVar13._M_t.
        super___uniq_ptr_impl<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::Node_**>,_std::default_delete<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::Node_**>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::Node_**>_*,_std::default_delete<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::Node_**>_>_>
        .
        super__Head_base<0UL,_Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::Node_**>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::Node_**>,_std::default_delete<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::Node_**>_>,_true,_true>
              )(__uniq_ptr_data<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::Node_**>,_std::default_delete<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::Node_**>_>,_true,_true>
                )local_80._self, (char)iVar14 == '\0') {
    if (*(Node ****)
         ((long)local_80._self._M_t.
                super___uniq_ptr_impl<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::Node_**>,_std::default_delete<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::Node_**>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::Node_**>_*,_std::default_delete<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::Node_**>_>_>
                .
                super__Head_base<0UL,_Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::Node_**>_*,_false>
                ._M_head_impl + 0x10) ==
        *(Node ****)
         ((long)local_80._self._M_t.
                super___uniq_ptr_impl<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::Node_**>,_std::default_delete<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::Node_**>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::Node_**>_*,_std::default_delete<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::Node_**>_>_>
                .
                super__Head_base<0UL,_Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::Node_**>_*,_false>
                ._M_head_impl + 0x18)) {
      ::Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::Node_**>::
      expand((Stack<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::Node_**> *)
             local_80._self._M_t.
             super___uniq_ptr_impl<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::Node_**>,_std::default_delete<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::Node_**>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::Node_**>_*,_std::default_delete<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::Node_**>_>_>
             .
             super__Head_base<0UL,_Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::Node_**>_*,_false>
             ._M_head_impl);
    }
    **(Node ****)
      ((long)SVar13._M_t.
             super___uniq_ptr_impl<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::Node_**>,_std::default_delete<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::Node_**>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::Node_**>_*,_std::default_delete<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::Node_**>_>_>
             .
             super__Head_base<0UL,_Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::Node_**>_*,_false>
             ._M_head_impl + 0x10) = inode;
    ppppNVar1 = (Node ****)
                ((long)SVar13._M_t.
                       super___uniq_ptr_impl<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::Node_**>,_std::default_delete<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::Node_**>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::Node_**>_*,_std::default_delete<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::Node_**>_>_>
                       .
                       super__Head_base<0UL,_Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::Node_**>_*,_false>
                       ._M_head_impl + 0x10);
    *ppppNVar1 = *ppppNVar1 + 1;
    pIVar4 = (IntermediateNode *)*inode;
    local_a8._capacity = CONCAT44(local_a8._capacity._4_4_,pIVar4->childVar);
    pEVar15 = ::Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash>::
              findEntry((DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash>
                         *)__filename,(uint *)&local_a8);
    local_88._content = (pEVar15->_val)._content;
    TVar18 = Kernel::TermList::top(&local_88);
    iVar14 = (*(pIVar4->super_Node)._vptr_Node[10])
                       (pIVar4,TVar18._inner._inner._0_8_,(ulong)(TVar18._inner._inner._8_4_ & 0xff)
                        ,0);
    inode = (Node **)CONCAT44(extraout_var,iVar14);
    uVar5 = (((IntermediateNode *)*inode)->super_Node)._term._content;
    if (uVar5 != local_88._content) {
      uVar3 = *(uint *)(uVar5 + 0xc);
      local_a8._capacity = 0x78;
      local_a8._stack = (TermList **)::operator_new(0x3c0,0x10);
      local_a8._end = local_a8._stack + local_a8._capacity;
      local_a8._cursor = local_a8._stack;
      if (local_a8._capacity == 0) {
        ::Lib::Stack<Kernel::TermList_*>::expand(&local_a8);
      }
      TVar12._content = local_88._content;
      *local_a8._cursor = (TermList *)((ulong)(uVar3 & 0xfffffff) * 8 + 0x28 + uVar5);
      local_a8._cursor = local_a8._cursor + 1;
      uVar3 = *(uint *)(local_88._content + 0xc);
      if (local_a8._cursor == local_a8._end) {
        ::Lib::Stack<Kernel::TermList_*>::expand(&local_a8);
      }
      *local_a8._cursor = (TermList *)(TVar12._content + (ulong)(uVar3 & 0xfffffff) * 8 + 0x28);
      local_a8._cursor = local_a8._cursor + 1;
      while (local_a8._cursor != local_a8._stack) {
        pTVar6 = local_a8._cursor[-1];
        ppTVar2 = local_a8._cursor + -2;
        pTVar7 = local_a8._cursor[-2];
        local_a8._cursor = ppTVar2;
        if ((pTVar6[-1]._content & 3) != 2) {
          if (ppTVar2 == local_a8._end) {
            ::Lib::Stack<Kernel::TermList_*>::expand(&local_a8);
          }
          *local_a8._cursor = pTVar7 + -1;
          local_a8._cursor = local_a8._cursor + 1;
          if (local_a8._cursor == local_a8._end) {
            ::Lib::Stack<Kernel::TermList_*>::expand(&local_a8);
          }
          *local_a8._cursor = pTVar6 + -1;
          local_a8._cursor = local_a8._cursor + 1;
        }
        uVar16 = pTVar7->_content;
        if (uVar16 != pTVar6->_content) {
          if ((uVar16 & 1) == 0) {
            uVar17 = (ulong)(*(uint *)(uVar16 + 0xc) & 0xfffffff);
            if ((*(uint *)(uVar16 + 0x28 + uVar17 * 8) & 3) != 2) {
              if (local_a8._cursor == local_a8._end) {
                ::Lib::Stack<Kernel::TermList_*>::expand(&local_a8);
              }
              *local_a8._cursor = (TermList *)(uVar17 * 8 + 0x28 + uVar16);
              local_a8._cursor = local_a8._cursor + 1;
              uVar5 = pTVar6->_content;
              uVar3 = *(uint *)(uVar5 + 0xc);
              if (local_a8._cursor == local_a8._end) {
                ::Lib::Stack<Kernel::TermList_*>::expand(&local_a8);
              }
              *local_a8._cursor = (TermList *)(uVar5 + (ulong)(uVar3 & 0xfffffff) * 8 + 0x28);
              local_a8._cursor = local_a8._cursor + 1;
            }
          }
          else {
            ::Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash>::set
                      ((DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash> *
                       )__filename,(uint)(uVar16 >> 2),(TermList)pTVar6->_content);
          }
        }
      }
      if (local_a8._stack != (TermList **)0x0) {
        uVar16 = local_a8._capacity * 8 + 0xf & 0xfffffffffffffff0;
        if (uVar16 == 0) {
          *local_a8._stack = (TermList *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
          ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = local_a8._stack;
        }
        else if (uVar16 < 0x11) {
          *local_a8._stack = (TermList *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
          ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = local_a8._stack;
        }
        else if (uVar16 < 0x19) {
          *local_a8._stack = (TermList *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
          ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = local_a8._stack;
        }
        else if (uVar16 < 0x21) {
          *local_a8._stack = (TermList *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
          ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = local_a8._stack;
        }
        else if (uVar16 < 0x31) {
          *local_a8._stack = (TermList *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
          ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = local_a8._stack;
        }
        else if (uVar16 < 0x41) {
          *local_a8._stack = (TermList *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
          ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = local_a8._stack;
        }
        else {
          operator_delete(local_a8._stack,0x10);
        }
      }
    }
  }
  pIVar4 = (IntermediateNode *)*inode;
  local_68[4] = 0;
  local_68[5] = 0;
  local_68[2] = 0;
  local_68[3] = 0;
  local_68[1] = 0;
  local_38 = 0;
  local_68[0] = (ulong)*(byte *)&(local_70->
                                 super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>_>_>
                                 ).
                                 super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>_>
                                 .
                                 super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>
                & 0xffffffffffffff03;
  f.other = local_70;
  f.this = (DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>_>_>_>
            *)local_68;
  ::Lib::CoproductImpl::
  RawCoproduct<Kernel::SelectedSummand,Kernel::SelectedIntegerEquality,Kernel::SelectedUninterpretedEquality>
  ::
  switchN<Lib::CoproductImpl::TrivialOperations::CopyCons::DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,Kernel::SelectedIntegerEquality,Kernel::SelectedUninterpretedEquality>>>>::DefaultImpl(Lib::CoproductImpl::TrivialOperations::CopyCons::DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,Kernel::SelectedIntegerEquality,Kernel::SelectedUninterpretedEquality>>>>const&)::_lambda(auto:1)_1_>
            ((RawCoproduct<Kernel::SelectedSummand,Kernel::SelectedIntegerEquality,Kernel::SelectedUninterpretedEquality>
              *)local_68,f);
  (*(pIVar4->super_Node)._vptr_Node[10])(pIVar4,local_68);
  ensureLeafEfficiency((Leaf **)inode);
  do {
    iVar14 = (*(((IntermediateNode *)*inode)->super_Node)._vptr_Node[3])();
    if ((char)iVar14 == '\0') break;
    pIVar4 = (IntermediateNode *)*inode;
    local_a8._capacity = (pIVar4->super_Node)._term._content;
    pppNVar8 = *(Node ****)
                ((long)local_80._self._M_t.
                       super___uniq_ptr_impl<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::Node_**>,_std::default_delete<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::Node_**>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::Node_**>_*,_std::default_delete<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::Node_**>_>_>
                       .
                       super__Head_base<0UL,_Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::Node_**>_*,_false>
                       ._M_head_impl + 8);
    pppNVar9 = *(Node ****)
                ((long)local_80._self._M_t.
                       super___uniq_ptr_impl<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::Node_**>,_std::default_delete<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::Node_**>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::Node_**>_*,_std::default_delete<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::Node_**>_>_>
                       .
                       super__Head_base<0UL,_Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::Node_**>_*,_false>
                       ._M_head_impl + 0x10);
    if (pppNVar9 == pppNVar8) {
      if (pIVar4 != (IntermediateNode *)0x0) {
        (*(pIVar4->super_Node)._vptr_Node[1])(pIVar4);
      }
      *inode = (Node *)0x0;
    }
    else {
      pNVar10 = *pppNVar9[-1];
      TVar18 = Kernel::TermList::top((TermList *)&local_a8);
      (*pNVar10->_vptr_Node[0xb])
                (pNVar10,TVar18._inner._inner._0_8_,(ulong)(TVar18._inner._inner._8_4_ & 0xff));
      if (pIVar4 != (IntermediateNode *)0x0) {
        (*(pIVar4->super_Node)._vptr_Node[1])(pIVar4);
      }
      pppNVar11 = *(Node ****)
                   ((long)local_80._self._M_t.
                          super___uniq_ptr_impl<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::Node_**>,_std::default_delete<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::Node_**>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::Node_**>_*,_std::default_delete<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::Node_**>_>_>
                          .
                          super__Head_base<0UL,_Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::Node_**>_*,_false>
                          ._M_head_impl + 0x10);
      *(Node ****)
       ((long)local_80._self._M_t.
              super___uniq_ptr_impl<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::Node_**>,_std::default_delete<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::Node_**>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::Node_**>_*,_std::default_delete<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::Node_**>_>_>
              .
              super__Head_base<0UL,_Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::Node_**>_*,_false>
              ._M_head_impl + 0x10) = pppNVar11 + -1;
      inode = pppNVar11[-1];
      ensureIntermediateNodeEfficiency((IntermediateNode **)inode);
    }
  } while (pppNVar9 != pppNVar8);
  ::Lib::
  Recycled<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::Node_**>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  ::~Recycled(&local_80);
  return extraout_EAX;
}

Assistant:

void SubstitutionTree<LeafData_>::remove(BindingMap& svBindings, LeafData ld)
{
  ASS_EQ(_iterCnt,0);
  auto pnode = &_root;
  DEBUG_REMOVE(0, "remove: ", svBindings, " from ", *this)

  ASS(*pnode);

  Recycled<Stack<Node**>> history;

  while (! (*pnode)->isLeaf()) {
    history->push(pnode);

    IntermediateNode* inode=static_cast<IntermediateNode*>(*pnode);

    unsigned boundVar=inode->childVar;
    TermList t = svBindings.get(boundVar);

    pnode=inode->childByTop(t.top(),false);
    ASS(pnode);


    TermList* s = &(*pnode)->term();
    ASS(TermList::sameTop(*s,t));

    if(*s==t) {
      continue;
    }

    ASS(! s->isVar());
    TermList* ss = s->term()->args();
    ASS(!ss->isEmpty());

    // computing the disagreement set of the two terms
    Stack<TermList*> subterms(120);

    subterms.push(ss);
    subterms.push(t.term()->args());
    while (! subterms.isEmpty()) {
      TermList* tt = subterms.pop();
      ss = subterms.pop();
      if (tt->next()->isEmpty()) {
	ASS(ss->next()->isEmpty());
      }
      else {
	subterms.push(ss->next());
	subterms.push(tt->next());
      }
      if (*ss==*tt) {
	continue;
      }
      if (ss->isVar()) {
	ASS(ss->isSpecialVar());
	svBindings.set(ss->var(),*tt);
	continue;
      }
      ASS(! tt->isVar());
      ASS(ss->term()->functor() == tt->term()->functor());
      ss = ss->term()->args();
      if (! ss->isEmpty()) {
	ASS(! tt->term()->args()->isEmpty());
	subterms.push(ss);
	subterms.push(tt->term()->args());
      }
    }
  }

  ASS ((*pnode)->isLeaf());


  Leaf* lnode = static_cast<Leaf*>(*pnode);
  lnode->remove(ld);
  ensureLeafEfficiency(reinterpret_cast<Leaf**>(pnode));

  while( (*pnode)->isEmpty() ) {
    TermList term=(*pnode)->term();
    if(history->isEmpty()) {
      delete *pnode;
      *pnode=0;
      DEBUG_REMOVE(0, "out: ", *this);
      return;
    } else {
      Node* node=*pnode;
      IntermediateNode* parent=static_cast<IntermediateNode*>(*history->top());
      parent->remove(term.top());
      delete node;
      pnode = history->pop();
      ensureIntermediateNodeEfficiency(reinterpret_cast<IntermediateNode**>(pnode));
    }
  }
  DEBUG_REMOVE(0, "out: ", *this);
}